

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::setAllOnes(SVInt *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t *puVar3;
  SVInt *in_RDI;
  SVInt *in_stack_00000010;
  uint32_t i;
  uint local_c;
  
  if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) != 0) {
    (in_RDI->super_SVIntStorage).unknownFlag = false;
    if ((in_RDI->super_SVIntStorage).field_0.val != 0) {
      operator_delete__((void *)0x2a2a0a);
    }
    uVar2 = getNumWords((SVInt *)0x2a2a14);
    if (1 < uVar2) {
      getNumWords((SVInt *)0x2a2a23);
      puVar3 = (uint64_t *)operator_new__(0x2a2a46);
      (in_RDI->super_SVIntStorage).field_0.pVal = puVar3;
    }
  }
  bVar1 = isSingleWord(in_RDI);
  if (bVar1) {
    (in_RDI->super_SVIntStorage).field_0.val = 0xffffffffffffffff;
  }
  else {
    for (local_c = 0; uVar2 = getNumWords((SVInt *)0x2a2a8b), local_c < uVar2; local_c = local_c + 1
        ) {
      (in_RDI->super_SVIntStorage).field_0.pVal[local_c] = 0xffffffffffffffff;
    }
  }
  clearUnusedBits(in_stack_00000010);
  return;
}

Assistant:

void SVInt::setAllOnes() {
    // we don't have unknown digits anymore, so reallocate if necessary
    if (unknownFlag) {
        unknownFlag = false;
        delete[] pVal;
        if (getNumWords() > 1)
            pVal = new uint64_t[getNumWords()];
    }

    if (isSingleWord())
        val = UINT64_MAX;
    else {
        for (uint32_t i = 0; i < getNumWords(); i++)
            pVal[i] = UINT64_MAX;
    }
    clearUnusedBits();
}